

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O2

int nghttp2_stream_attach_item(nghttp2_stream *stream,nghttp2_outbound_item *item)

{
  int iVar1;
  int iVar2;
  
  if ((stream->flags & 0xc) != 0) {
    __assert_fail("(stream->flags & NGHTTP2_STREAM_FLAG_DEFERRED_ALL) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_stream.c"
                  ,0x1e2,"int nghttp2_stream_attach_item(nghttp2_stream *, nghttp2_outbound_item *)"
                 );
  }
  if (stream->item == (nghttp2_outbound_item *)0x0) {
    stream->item = item;
    iVar2 = 0;
    if ((stream->flags & 0x10) == 0) {
      iVar1 = stream_update_dep_on_attach_item(stream);
      iVar2 = 0;
      if (iVar1 != 0) {
        stream->item = (nghttp2_outbound_item *)0x0;
        iVar2 = iVar1;
      }
    }
    return iVar2;
  }
  __assert_fail("stream->item == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_stream.c"
                ,0x1e3,"int nghttp2_stream_attach_item(nghttp2_stream *, nghttp2_outbound_item *)");
}

Assistant:

int nghttp2_stream_attach_item(nghttp2_stream *stream,
                               nghttp2_outbound_item *item) {
  int rv;

  assert((stream->flags & NGHTTP2_STREAM_FLAG_DEFERRED_ALL) == 0);
  assert(stream->item == NULL);

  DEBUGF("stream: stream=%d attach item=%p\n", stream->stream_id, item);

  stream->item = item;

  if (stream->flags & NGHTTP2_STREAM_FLAG_NO_RFC7540_PRIORITIES) {
    return 0;
  }

  rv = stream_update_dep_on_attach_item(stream);
  if (rv != 0) {
    /* This may relave stream->queued == 1, but stream->item == NULL.
       But only consequence of this error is fatal one, and session
       destruction.  In that execution path, these inconsistency does
       not matter. */
    stream->item = NULL;
    return rv;
  }

  return 0;
}